

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPiece.h
# Opt level: O0

string * __thiscall muduo::StringPiece::as_string_abi_cxx11_(StringPiece *this)

{
  int iVar1;
  char *pcVar2;
  StringPiece *in_RSI;
  string *in_RDI;
  allocator local_11 [17];
  
  pcVar2 = data(in_RSI);
  iVar1 = size(in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar2,(long)iVar1,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

string as_string() const {
    return string(data(), size());
  }